

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

void __thiscall
llvm::DWARFContext::DWARFContext
          (DWARFContext *this,
          unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_> *DObj,
          string *DWPName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_> *pSVar5;
  
  (this->super_DIContext).Kind = CK_DWARF;
  (this->super_DIContext)._vptr_DIContext = (_func_int **)&PTR__DWARFContext_00d77960;
  (this->NormalUnits).
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX =
       &(this->NormalUnits).
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  ;
  pSVar5 = &(this->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
  ;
  (pSVar5->
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.Size = 0;
  (pSVar5->
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.Capacity = 1;
  *(undefined8 *)&(this->NormalUnits).Parser.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->NormalUnits).Parser.super__Function_base._M_functor + 8) = 0;
  (this->NormalUnits).Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->NormalUnits).Parser._M_invoker = (_Invoker_type)0x0;
  (this->NormalUnits).NumInfoUnits = -1;
  (this->CUIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>.
  super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl = (DWARFUnitIndex *)0x0;
  (this->GdbIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFGdbIndex,_std::default_delete<llvm::DWARFGdbIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>.
  super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>._M_head_impl = (DWARFGdbIndex *)0x0;
  (this->TUIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>.
  super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl = (DWARFUnitIndex *)0x0;
  (this->Abbrev)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugAbbrev_*,_std::default_delete<llvm::DWARFDebugAbbrev>_>.
  super__Head_base<0UL,_llvm::DWARFDebugAbbrev_*,_false>._M_head_impl = (DWARFDebugAbbrev *)0x0;
  (this->Loc)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugLoc,_std::default_delete<llvm::DWARFDebugLoc>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugLoc_*,_std::default_delete<llvm::DWARFDebugLoc>_>.
  super__Head_base<0UL,_llvm::DWARFDebugLoc_*,_false>._M_head_impl = (DWARFDebugLoc *)0x0;
  (this->Aranges)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugAranges,_std::default_delete<llvm::DWARFDebugAranges>_>._M_t
  .super__Tuple_impl<0UL,_llvm::DWARFDebugAranges_*,_std::default_delete<llvm::DWARFDebugAranges>_>.
  super__Head_base<0UL,_llvm::DWARFDebugAranges_*,_false>._M_head_impl = (DWARFDebugAranges *)0x0;
  (this->Line)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugLine_*,_std::default_delete<llvm::DWARFDebugLine>_>.
  super__Head_base<0UL,_llvm::DWARFDebugLine_*,_false>._M_head_impl = (DWARFDebugLine *)0x0;
  (this->DebugFrame)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugFrame_*,_std::default_delete<llvm::DWARFDebugFrame>_>.
  super__Head_base<0UL,_llvm::DWARFDebugFrame_*,_false>._M_head_impl = (DWARFDebugFrame *)0x0;
  (this->EHFrame)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugFrame_*,_std::default_delete<llvm::DWARFDebugFrame>_>.
  super__Head_base<0UL,_llvm::DWARFDebugFrame_*,_false>._M_head_impl = (DWARFDebugFrame *)0x0;
  (this->Macro)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugMacro,_std::default_delete<llvm::DWARFDebugMacro>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugMacro_*,_std::default_delete<llvm::DWARFDebugMacro>_>.
  super__Head_base<0UL,_llvm::DWARFDebugMacro_*,_false>._M_head_impl = (DWARFDebugMacro *)0x0;
  (this->Names)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>.
  super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl = (DWARFDebugNames *)0x0;
  (this->AppleNames)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  (this->AppleTypes)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  (this->AppleNamespaces)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  (this->AppleObjC)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  (this->DWOUnits).
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX =
       &(this->DWOUnits).
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  ;
  pSVar5 = &(this->DWOUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
  ;
  (pSVar5->
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.Size = 0;
  (pSVar5->
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.Capacity = 1;
  (this->DWOUnits).Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->DWOUnits).Parser._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->DWOUnits).Parser.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->DWOUnits).Parser.super__Function_base._M_functor + 8) = 0;
  (this->DWOUnits).NumInfoUnits = -1;
  (this->AbbrevDWO)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugAbbrev_*,_std::default_delete<llvm::DWARFDebugAbbrev>_>.
  super__Head_base<0UL,_llvm::DWARFDebugAbbrev_*,_false>._M_head_impl = (DWARFDebugAbbrev *)0x0;
  this->MaxVersion = 0;
  (this->DWOFiles).super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  (this->DWOFiles).super_StringMapImpl.NumBuckets = 0;
  (this->DWOFiles).super_StringMapImpl.NumItems = 0;
  (this->DWOFiles).super_StringMapImpl.NumTombstones = 0;
  (this->DWOFiles).super_StringMapImpl.ItemSize = 0x18;
  paVar2 = &(this->DWPName).field_2;
  (this->DWP).super___weak_ptr<llvm::DWARFContext::DWOFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->DWP).super___weak_ptr<llvm::DWARFContext::DWOFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->CheckedForDWP = false;
  (this->DWPName)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (DWPName->_M_dataplus)._M_p;
  paVar1 = &DWPName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&DWPName->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->DWPName).field_2 + 8) = uVar4;
  }
  else {
    (this->DWPName)._M_dataplus._M_p = pcVar3;
    (this->DWPName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->DWPName)._M_string_length = DWPName->_M_string_length;
  (DWPName->_M_dataplus)._M_p = (pointer)paVar1;
  DWPName->_M_string_length = 0;
  (DWPName->field_2)._M_local_buf[0] = '\0';
  (this->RegInfo)._M_t.
  super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>.
  super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl = (MCRegisterInfo *)0x0;
  (this->DObj)._M_t.
  super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>._M_t
  .super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>.
  super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl =
       (DObj->_M_t).
       super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
       .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  (DObj->_M_t).
  super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>._M_t
  .super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>.
  super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl = (DWARFObject *)0x0;
  return;
}

Assistant:

DWARFContext::DWARFContext(std::unique_ptr<const DWARFObject> DObj,
                           std::string DWPName)
    : DIContext(CK_DWARF), DWPName(std::move(DWPName)), DObj(std::move(DObj)) {}